

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at_quick_exit.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int local_10;
  int i;
  
  iVar1 = at_quick_exit(checkhandler);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/at_quick_exit.c, line %d - %s\n"
           ,0x3e,"at_quick_exit( &checkhandler ) == 0");
  }
  for (local_10 = 0; local_10 < 0x20; local_10 = local_10 + 1) {
    iVar1 = at_quick_exit(counthandler);
    if (iVar1 != 0) {
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/at_quick_exit.c, line %d - %s\n"
             ,0x42,"at_quick_exit( &counthandler ) == 0");
    }
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || __STDC_VERSION__ >= 201112L
    int i;
    TESTCASE( at_quick_exit( &checkhandler ) == 0 );

    for ( i = 0; i < 32; ++i )
    {
        TESTCASE( at_quick_exit( &counthandler ) == 0 );
    }

#endif
    return TEST_RESULTS;
}